

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O3

void Vertical_Sweep_Drop(black_PWorker worker,Short y,FT_F26Dot6 x1,FT_F26Dot6 x2,
                        PProfile_conflict left,PProfile_conflict right)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  lVar6 = (long)worker->precision;
  uVar3 = -lVar6;
  uVar9 = (x1 + lVar6) - 1U & uVar3;
  uVar8 = uVar3 & x2;
  uVar4 = uVar9;
  if ((long)uVar9 <= (long)uVar8) {
    bVar5 = (byte)worker->precision_bits;
    goto LAB_0023aa7f;
  }
  if (uVar9 != uVar8 + lVar6) {
    return;
  }
  uVar1 = left->flags;
  uVar10 = uVar8;
  switch(uVar1 & 7) {
  case 0:
    break;
  case 1:
  case 5:
    if ((left->next == right) && (left->height < 1)) {
      if ((uVar1 & 0x10) == 0) {
        return;
      }
      if (x2 - x1 < (long)worker->precision_half) {
        return;
      }
    }
    if ((right->next == left) && (left->start == (long)y)) {
      if ((uVar1 & 0x20) == 0) {
        return;
      }
      if (x2 - x1 < (long)worker->precision_half) {
        return;
      }
    }
    if ((uVar1 & 7) != 1) goto switchD_0023a9b9_caseD_4;
    break;
  default:
    return;
  case 4:
switchD_0023a9b9_caseD_4:
    iVar2 = worker->precision * 0x3f;
    iVar7 = iVar2 + 0x3f;
    if (-1 < iVar2) {
      iVar7 = iVar2;
    }
    uVar10 = (long)(iVar7 >> 6) + x2 + x1 >> 1 & uVar3;
  }
  bVar5 = (byte)worker->precision_bits;
  if ((-1 < (long)uVar10) && (uVar4 = uVar10, (ulong)worker->bWidth <= uVar10 >> (bVar5 & 0x3f))) {
    uVar4 = uVar8;
  }
  if (uVar4 != uVar9) {
    uVar8 = uVar9;
  }
  uVar8 = (long)uVar8 >> (bVar5 & 0x3f);
  if (((-1 < (long)uVar8) && (uVar8 < worker->bWidth)) &&
     ((char)(worker->bLine[uVar8 >> 3] << ((byte)uVar8 & 7)) < '\0')) {
    return;
  }
LAB_0023aa7f:
  uVar4 = (long)uVar4 >> (bVar5 & 0x3f);
  if ((-1 < (long)uVar4) && (uVar4 < worker->bWidth)) {
    worker->bLine[uVar4 >> 3] = worker->bLine[uVar4 >> 3] | 0x80U >> ((byte)uVar4 & 7);
  }
  return;
}

Assistant:

static void
  Vertical_Sweep_Drop( RAS_ARGS Short       y,
                                FT_F26Dot6  x1,
                                FT_F26Dot6  x2,
                                PProfile    left,
                                PProfile    right )
  {
    Long   e1, e2, pxl;
    Short  c1, f1;


    FT_TRACE7(( "  y=%d x=[% .12f;% .12f]",
                y,
                (double)x1 / (double)ras.precision,
                (double)x2 / (double)ras.precision ));

    /* Drop-out control */

    /*   e2            x2                    x1           e1   */
    /*                                                         */
    /*                 ^                     |                 */
    /*                 |                     |                 */
    /*   +-------------+---------------------+------------+    */
    /*                 |                     |                 */
    /*                 |                     v                 */
    /*                                                         */
    /* pixel         contour              contour       pixel  */
    /* center                                           center */

    /* drop-out mode    scan conversion rules (as defined in OpenType) */
    /* --------------------------------------------------------------- */
    /*  0                1, 2, 3                                       */
    /*  1                1, 2, 4                                       */
    /*  2                1, 2                                          */
    /*  3                same as mode 2                                */
    /*  4                1, 2, 5                                       */
    /*  5                1, 2, 6                                       */
    /*  6, 7             same as mode 2                                */

    e1  = CEILING( x1 );
    e2  = FLOOR  ( x2 );
    pxl = e1;

    if ( e1 > e2 )
    {
      Int  dropOutControl = left->flags & 7;


      if ( e1 == e2 + ras.precision )
      {
        switch ( dropOutControl )
        {
        case 0: /* simple drop-outs including stubs */
          pxl = e2;
          break;

        case 4: /* smart drop-outs including stubs */
          pxl = SMART( x1, x2 );
          break;

        case 1: /* simple drop-outs excluding stubs */
        case 5: /* smart drop-outs excluding stubs  */

          /* Drop-out Control Rules #4 and #6 */

          /* The specification neither provides an exact definition */
          /* of a `stub' nor gives exact rules to exclude them.     */
          /*                                                        */
          /* Here the constraints we use to recognize a stub.       */
          /*                                                        */
          /*  upper stub:                                           */
          /*                                                        */
          /*   - P_Left and P_Right are in the same contour         */
          /*   - P_Right is the successor of P_Left in that contour */
          /*   - y is the top of P_Left and P_Right                 */
          /*                                                        */
          /*  lower stub:                                           */
          /*                                                        */
          /*   - P_Left and P_Right are in the same contour         */
          /*   - P_Left is the successor of P_Right in that contour */
          /*   - y is the bottom of P_Left                          */
          /*                                                        */
          /* We draw a stub if the following constraints are met.   */
          /*                                                        */
          /*   - for an upper or lower stub, there is top or bottom */
          /*     overshoot, respectively                            */
          /*   - the covered interval is greater or equal to a half */
          /*     pixel                                              */

          /* upper stub test */
          if ( left->next == right                &&
               left->height <= 0                  &&
               !( left->flags & Overshoot_Top   &&
                  x2 - x1 >= ras.precision_half ) )
            goto Exit;

          /* lower stub test */
          if ( right->next == left                 &&
               left->start == y                    &&
               !( left->flags & Overshoot_Bottom &&
                  x2 - x1 >= ras.precision_half  ) )
            goto Exit;

          if ( dropOutControl == 1 )
            pxl = e2;
          else
            pxl = SMART( x1, x2 );
          break;

        default: /* modes 2, 3, 6, 7 */
          goto Exit;  /* no drop-out control */
        }

        /* undocumented but confirmed: If the drop-out would result in a  */
        /* pixel outside of the bounding box, use the pixel inside of the */
        /* bounding box instead                                           */
        if ( pxl < 0 )
          pxl = e1;
        else if ( TRUNC( pxl ) >= ras.bWidth )
          pxl = e2;

        /* check that the other pixel isn't set */
        e1 = ( pxl == e1 ) ? e2 : e1;

        e1 = TRUNC( e1 );

        c1 = (Short)( e1 >> 3 );
        f1 = (Short)( e1 &  7 );

        if ( e1 >= 0 && e1 < ras.bWidth     &&
             ras.bLine[c1] & ( 0x80 >> f1 ) )
          goto Exit;
      }
      else
        goto Exit;
    }

    e1 = TRUNC( pxl );

    if ( e1 >= 0 && e1 < ras.bWidth )
    {
      FT_TRACE7(( " -> x=%ld", e1 ));

      c1 = (Short)( e1 >> 3 );
      f1 = (Short)( e1 & 7 );

      ras.bLine[c1] |= (char)( 0x80 >> f1 );
    }

  Exit:
    FT_TRACE7(( " dropout=%d\n", left->flags & 7 ));
  }